

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

double matd_vec_dot_product(matd_t *a,matd_t *b)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x387,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
  }
  if (b != (matd_t *)0x0) {
    if ((a->ncols == 1) || (a->nrows == 1)) {
      if (b->nrows == 1 || b->ncols == 1) {
        uVar1 = a->ncols * a->nrows;
        if (uVar1 == b->nrows * b->ncols) {
          uVar3 = 0;
          uVar2 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar2 = uVar3;
          }
          dVar4 = 0.0;
          for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
            dVar4 = dVar4 + (double)a[uVar3 + 1] * (double)b[uVar3 + 1];
          }
          return dVar4;
        }
        __assert_fail("adim == bdim",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x38c,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
      }
    }
    __assert_fail("matd_is_vector(a) && matd_is_vector(b)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x389,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
  }
  __assert_fail("b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x388,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
}

Assistant:

double matd_vec_dot_product(const matd_t *a, const matd_t *b)
{
    assert(a != NULL);
    assert(b != NULL);
    assert(matd_is_vector(a) && matd_is_vector(b));
    int adim = a->ncols*a->nrows;
    int bdim = b->ncols*b->nrows;
    assert(adim == bdim);

    double acc = 0;
    for (int i = 0; i < adim; i++) {
        acc += a->data[i] * b->data[i];
    }
    return acc;
}